

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# column_reader.cpp
# Opt level: O1

void __thiscall duckdb::ColumnReader::PreparePage(ColumnReader *this,PageHeader *page_hdr)

{
  type codec;
  int iVar1;
  ParquetReader *this_00;
  TProtocol *iprot;
  data_ptr_t src;
  ResizeableBuffer *pRVar2;
  runtime_error *this_01;
  ColumnReader *this_02;
  ResizeableBuffer compressed_buffer;
  ResizeableBuffer local_68;
  
  AllocateBlock(this,(long)page_hdr->uncompressed_page_size + 1);
  if ((this->chunk->meta_data).codec != UNCOMPRESSED) {
    local_68.super_ByteBuffer.ptr = (data_ptr_t)0x0;
    local_68.super_ByteBuffer.len = 0;
    AllocatedData::AllocatedData(&local_68.allocated_data);
    local_68.alloc_len = 0;
    ResizeableBuffer::resize
              (&local_68,this->reader->allocator,(long)page_hdr->compressed_page_size + 1);
    ParquetReader::ReadData
              (this->reader,this->protocol,local_68.super_ByteBuffer.ptr,
               page_hdr->compressed_page_size);
    src = local_68.super_ByteBuffer.ptr;
    codec = (this->chunk->meta_data).codec;
    iVar1 = page_hdr->compressed_page_size;
    this_02 = (ColumnReader *)&this->block;
    pRVar2 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->
                       ((shared_ptr<duckdb::ResizeableBuffer,_true> *)this_02);
    DecompressInternal(this_02,codec,src,(long)iVar1,(pRVar2->super_ByteBuffer).ptr,
                       (long)page_hdr->uncompressed_page_size);
    AllocatedData::~AllocatedData(&local_68.allocated_data);
    return;
  }
  if (page_hdr->compressed_page_size == page_hdr->uncompressed_page_size) {
    this_00 = this->reader;
    iprot = this->protocol;
    pRVar2 = shared_ptr<duckdb::ResizeableBuffer,_true>::operator->(&this->block);
    ParquetReader::ReadData
              (this_00,iprot,(pRVar2->super_ByteBuffer).ptr,page_hdr->compressed_page_size);
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  ::std::runtime_error::runtime_error(this_01,"Page size mismatch");
  __cxa_throw(this_01,&::std::runtime_error::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ColumnReader::PreparePage(PageHeader &page_hdr) {
	AllocateBlock(page_hdr.uncompressed_page_size + 1);
	if (chunk->meta_data.codec == CompressionCodec::UNCOMPRESSED) {
		if (page_hdr.compressed_page_size != page_hdr.uncompressed_page_size) {
			throw std::runtime_error("Page size mismatch");
		}
		reader.ReadData(*protocol, block->ptr, page_hdr.compressed_page_size);
		return;
	}

	ResizeableBuffer compressed_buffer;
	compressed_buffer.resize(GetAllocator(), page_hdr.compressed_page_size + 1);
	reader.ReadData(*protocol, compressed_buffer.ptr, page_hdr.compressed_page_size);

	DecompressInternal(chunk->meta_data.codec, compressed_buffer.ptr, page_hdr.compressed_page_size, block->ptr,
	                   page_hdr.uncompressed_page_size);
}